

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::HttpClientAdapter::openWebSocket
          (HttpClientAdapter *this,StringPtr url,HttpHeaders *headers)

{
  long lVar1;
  PromiseArena *pPVar2;
  PromiseArenaMember *node;
  SourceLocation location;
  OwnPromiseNode OVar3;
  undefined8 uVar4;
  char *pcVar5;
  size_t sVar6;
  HttpHeaderTable *node_00;
  WeakFulfiller<kj::HttpClient::WebSocketResponse> *params;
  PromiseArena *pPVar7;
  void *pvVar8;
  int __flags;
  void *extraout_RDX;
  void *extraout_RDX_00;
  __fn *in_R8;
  __fn *__arg;
  TransformPromiseNodeBase *this_00;
  undefined1 *__n;
  StringPtr value;
  Promise<void> promise;
  Own<kj::NullStream,_std::nullptr_t> in;
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  PromiseFulfillerPair<kj::HttpClient::WebSocketResponse> paf;
  PromiseFulfillerPair<kj::Promise<void>_> requestPaf;
  String urlCopy;
  Refcounted *refcounted;
  OwnPromiseNode local_138;
  OwnPromiseNode local_130;
  undefined1 local_128 [16];
  ArrayDisposer *local_118;
  long local_110;
  OwnPromiseNode local_108;
  WeakFulfillerBase *pWVar10;
  long *plVar11;
  PromiseArenaMember *in_stack_ffffffffffffff10;
  PromiseArenaMember *node_01;
  undefined8 *local_e8;
  long *local_e0;
  String local_d8;
  HttpHeaderTable *local_b8;
  char *local_b0;
  char *local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  HttpHeaders local_90;
  HttpHeaders *pHVar9;
  
  pHVar9 = headers;
  __arg = in_R8;
  heapString(&local_d8,(size_t)((long)&headers[-1].ownedStrings.builder.disposer + 7));
  __flags = (int)pHVar9;
  __n = (undefined1 *)((long)&headers[-1].ownedStrings.builder.disposer + 7);
  pvVar8 = extraout_RDX;
  if (__n != (undefined1 *)0x0) {
    pHVar9 = (HttpHeaders *)local_d8.content.size_;
    if ((HttpHeaders *)local_d8.content.size_ != (HttpHeaders *)0x0) {
      pHVar9 = (HttpHeaders *)local_d8.content.ptr;
    }
    memcpy(pHVar9,(void *)url.content.size_,(size_t)__n);
    pvVar8 = extraout_RDX_00;
  }
  HttpHeaders::clone(&local_90,in_R8,pvVar8,__flags,__arg);
  heap<kj::HttpHeaders>((kj *)&local_118,&local_90);
  HttpHeaders::~HttpHeaders(&local_90);
  lVar1 = local_110;
  value.content.size_ = 10;
  value.content.ptr = "websocket";
  requireValidHeaderValue(value);
  lVar1 = *(long *)(lVar1 + 8);
  *(char **)(lVar1 + 0x40) = "websocket";
  *(undefined8 *)(lVar1 + 0x48) = 10;
  params = (WeakFulfiller<kj::HttpClient::WebSocketResponse> *)operator_new(0x18);
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<kj::HttpClient::WebSocketResponse>).super_PromiseRejector.
  _vptr_PromiseRejector = (_func_int **)&PTR_reject_006dc4e0;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006dc518;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::HttpClient::WebSocketResponse,kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<kj::HttpClient::WebSocketResponse>&>
            ((PromiseDisposer *)&local_90,params);
  local_108.ptr = (PromiseNode *)local_90.table;
  pWVar10 = &params->super_WeakFulfillerBase;
  pPVar7 = (PromiseArena *)operator_new(0x30);
  plVar11 = (long *)0x0;
  local_b8 = (HttpHeaderTable *)(pPVar7->bytes + 8);
  *(undefined ***)pPVar7->bytes = &PTR_send_006d9a60;
  *(undefined ***)(pPVar7->bytes + 8) = &PTR_disposeImpl_006d9a90;
  *(WeakFulfillerBase **)(pPVar7->bytes + 0x18) = &params->super_WeakFulfillerBase;
  *(WeakFulfiller<kj::HttpClient::WebSocketResponse> **)(pPVar7->bytes + 0x20) = params;
  pPVar7->bytes[0x28] = '\0';
  pPVar7->bytes[0x29] = '\0';
  pPVar7->bytes[0x2a] = '\0';
  pPVar7->bytes[0x2b] = '\0';
  pPVar7->bytes[0x2c] = '\0';
  pPVar7->bytes[0x2d] = '\0';
  pPVar7->bytes[0x2e] = '\0';
  pPVar7->bytes[0x2f] = '\0';
  pPVar7->bytes[0x10] = '\x01';
  pPVar7->bytes[0x11] = '\0';
  pPVar7->bytes[0x12] = '\0';
  pPVar7->bytes[0x13] = '\0';
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_a0 = "openWebSocket";
  local_98 = 0x1700001a57;
  location.function = (char *)0x0;
  location.fileName = (char *)pWVar10;
  location._16_8_ = in_stack_ffffffffffffff10;
  local_b0 = url.content.ptr;
  newPromiseAndFulfiller<kj::Promise<void>>(location);
  node_01 = (PromiseArenaMember *)0x0;
  pPVar2 = in_stack_ffffffffffffff10->arena;
  local_130.ptr = (PromiseNode *)in_stack_ffffffffffffff10;
  if (pPVar2 == (PromiseArena *)0x0 ||
      (ulong)((long)in_stack_ffffffffffffff10 - (long)pPVar2) < 0x30) {
    pvVar8 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_130,kj::_::IdentityFunc<void>::operator());
    *(undefined ***)((long)pvVar8 + 0x3d0) = &PTR_destroy_006d9d08;
    *(PromiseArena **)((long)pvVar8 + 0x3f8) = pPVar7;
    *(void **)((long)pvVar8 + 0x3d8) = pvVar8;
  }
  else {
    in_stack_ffffffffffffff10->arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(in_stack_ffffffffffffff10 + -3);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_130,kj::_::IdentityFunc<void>::operator());
    in_stack_ffffffffffffff10[-3]._vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_006d9d08;
    in_stack_ffffffffffffff10[-1].arena = pPVar7;
    in_stack_ffffffffffffff10[-3].arena = pPVar2;
  }
  local_90.table = (HttpHeaderTable *)0x587dd6;
  local_90.indexedHeaders.ptr = (StringPtr *)0x58bdba;
  local_90.indexedHeaders.size_ = 0xe00001b75;
  local_138.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)local_128,&local_138,(SourceLocation *)&local_90);
  OVar3.ptr = local_138.ptr;
  if ((TransformPromiseNodeBase *)local_138.ptr != (TransformPromiseNodeBase *)0x0) {
    local_138.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  node = *(PromiseArenaMember **)(pPVar7->bytes + 0x28);
  *(undefined8 *)(pPVar7->bytes + 0x28) = local_128._0_8_;
  if (node != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(node);
  }
  pcVar5 = local_b0;
  OVar3.ptr = local_130.ptr;
  if (&(local_130.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_130.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  local_128._8_8_ = operator_new(0x10);
  *(undefined ***)local_128._8_8_ = &PTR_read_006de1f8;
  *(undefined ***)(local_128._8_8_ + 8) = &PTR_write_006de290;
  local_128._0_8_ = &kj::_::HeapDisposer<kj::NullStream>::instance;
  pHVar9 = (HttpHeaders *)local_d8.content.ptr;
  if ((HttpHeaders *)local_d8.content.size_ == (HttpHeaders *)0x0) {
    pHVar9 = (HttpHeaders *)0x524569;
  }
  (**(code **)**(undefined8 **)(pcVar5 + 8))
            (&local_90,*(undefined8 **)(pcVar5 + 8),0,pHVar9,
             (char *)((long)(HttpHeaderTable **)local_d8.content.size_ +
                     (ulong)((HttpHeaders *)local_d8.content.size_ == (HttpHeaders *)0x0)),local_110
             ,local_128._8_8_,pPVar7);
  Promise<void>::
  attach<kj::Own<kj::NullStream,decltype(nullptr)>,kj::String,kj::Own<kj::HttpHeaders,decltype(nullptr)>>
            ((Promise<void> *)&local_138,(Own<kj::NullStream,_std::nullptr_t> *)&local_90,
             (String *)local_128,(Own<kj::HttpHeaders,_std::nullptr_t> *)&local_d8);
  node_00 = local_90.table;
  if (local_90.table != (HttpHeaderTable *)0x0) {
    local_90.table = (HttpHeaderTable *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00);
  }
  (**(code **)(*local_e0 + 0x10))(local_e0,&local_138);
  local_90.table = local_b8;
  local_90.indexedHeaders.ptr = (StringPtr *)pPVar7;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,decltype(nullptr)>>,kj::_::PromiseDisposer,kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,decltype(nullptr)>>
            ((PromiseDisposer *)this,&local_108,
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
              *)&local_90);
  if ((PromiseArena *)local_90.indexedHeaders.ptr != (PromiseArena *)0x0) {
    (*(code *)((((local_90.table)->namesById).builder.ptr)->content).ptr)
              (local_90.table,
               (byte *)((long)&(local_90.indexedHeaders.ptr)->content +
                       *(long *)(*(long *)&(local_90.indexedHeaders.ptr)->content + -0x10)));
  }
  OVar3.ptr = local_138.ptr;
  if ((TransformPromiseNodeBase *)local_138.ptr != (TransformPromiseNodeBase *)0x0) {
    local_138.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  uVar4 = local_128._8_8_;
  if ((long *)local_128._8_8_ != (long *)0x0) {
    local_128._8_8_ = (long *)0x0;
    (*(code *)**(undefined8 **)local_128._0_8_)
              (local_128._0_8_,uVar4 + *(long *)(*(long *)uVar4 + -0x10));
  }
  if (local_e0 != (long *)0x0) {
    (**(code **)*local_e8)(local_e8,(long)local_e0 + *(long *)(*local_e0 + -0x10));
  }
  if (node_01 != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(node_01);
  }
  if (plVar11 != (long *)0x0) {
    (**(pWVar10->super_Disposer)._vptr_Disposer)
              (pWVar10,(long)plVar11 + *(long *)(*plVar11 + -0x10));
  }
  OVar3.ptr = local_108.ptr;
  if ((HttpHeaderTable *)local_108.ptr != (HttpHeaderTable *)0x0) {
    local_108.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  if (local_110 != 0) {
    local_110 = 0;
    (**local_118->_vptr_ArrayDisposer)();
  }
  sVar6 = local_d8.content.size_;
  pcVar5 = local_d8.content.ptr;
  if ((HttpHeaders *)local_d8.content.ptr != (HttpHeaders *)0x0) {
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    (**(local_d8.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.content.disposer,pcVar5,1,sVar6,sVar6,0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<WebSocketResponse> openWebSocket(
      kj::StringPtr url, const HttpHeaders& headers) override {
    // We have to clone the URL and headers because HttpService implementation are allowed to
    // assume that they remain valid until the service handler completes whereas HttpClient callers
    // are allowed to destroy them immediately after the call. Also we need to add
    // `Upgrade: websocket` so that headers.isWebSocket() returns true on the service side.
    auto urlCopy = kj::str(url);
    auto headersCopy = kj::heap(headers.clone());
    headersCopy->set(HttpHeaderId::UPGRADE, "websocket");
    KJ_DASSERT(headersCopy->isWebSocket());

    auto paf = kj::newPromiseAndFulfiller<WebSocketResponse>();
    auto responder = kj::refcounted<WebSocketResponseImpl>(kj::mv(paf.fulfiller));

    auto requestPaf = kj::newPromiseAndFulfiller<kj::Promise<void>>();
    responder->setPromise(kj::mv(requestPaf.promise));

    auto in = kj::heap<kj::NullStream>();
    auto promise = service.request(HttpMethod::GET, urlCopy, *headersCopy, *in, *responder)
        .attach(kj::mv(in), kj::mv(urlCopy), kj::mv(headersCopy));
    requestPaf.fulfiller->fulfill(kj::mv(promise));

    return paf.promise.attach(kj::mv(responder));
  }